

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thief.c
# Opt level: O0

void thief_yell(CHAR_DATA *ch,CHAR_DATA *victim)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  CHAR_DATA *in_RSI;
  char buf [4608];
  CHAR_DATA *in_stack_ffffffffffffedc8;
  CHAR_DATA *in_stack_ffffffffffffedd0;
  CHAR_DATA *in_stack_ffffffffffffedd8;
  undefined4 in_stack_ffffffffffffede0;
  CHAR_DATA local_1218 [5];
  CHAR_DATA *local_10;
  
  local_10 = in_RSI;
  uVar2 = number_range((int)in_stack_ffffffffffffedd0,
                       (int)((ulong)in_stack_ffffffffffffedc8 >> 0x20));
  if (uVar2 < 2) {
    in_stack_ffffffffffffedd8 = local_1218;
    pcVar3 = pers(in_stack_ffffffffffffedd8,in_stack_ffffffffffffedd0);
    sprintf((char *)in_stack_ffffffffffffedd8,"%s is a lousy thief!",pcVar3);
  }
  else if (uVar2 == 2) {
    in_stack_ffffffffffffedd0 = local_1218;
    pcVar3 = pers(in_stack_ffffffffffffedd8,in_stack_ffffffffffffedd0);
    sprintf((char *)in_stack_ffffffffffffedd0,"%s tried to rob me!",pcVar3);
  }
  else if (uVar2 == 3) {
    in_stack_ffffffffffffedc8 = local_1218;
    pcVar3 = pers(in_stack_ffffffffffffedd8,in_stack_ffffffffffffedd0);
    sprintf((char *)in_stack_ffffffffffffedc8,"Keep your hands out of there, %s!",pcVar3);
  }
  bVar1 = is_awake(local_10);
  if (!bVar1) {
    local_10->position = 8;
    update_pos(in_stack_ffffffffffffedd0);
  }
  bVar1 = is_npc(in_stack_ffffffffffffedc8);
  if (!bVar1) {
    do_myell((CHAR_DATA *)CONCAT44(uVar2,in_stack_ffffffffffffede0),
             (char *)in_stack_ffffffffffffedd8,in_stack_ffffffffffffedd0);
  }
  one_hit((CHAR_DATA *)CONCAT44(uVar2,in_stack_ffffffffffffede0),in_stack_ffffffffffffedd8,
          (int)((ulong)in_stack_ffffffffffffedd0 >> 0x20));
  return;
}

Assistant:

void thief_yell(CHAR_DATA *ch, CHAR_DATA *victim)
{
	char buf[MSL];

	switch (number_range(0, 3))
	{
		case 0:
		case 1:
			sprintf(buf, "%s is a lousy thief!", pers(ch, victim));
			break;
		case 2:
			sprintf(buf, "%s tried to rob me!", pers(ch, victim));
			break;
		case 3:
			sprintf(buf, "Keep your hands out of there, %s!", pers(ch, victim));
			break;
	}

	if (!is_awake(victim))
	{
		victim->position = POS_STANDING;
		update_pos(victim);
	}

	if (!is_npc(victim))
		do_myell(victim, buf, ch);

	one_hit(victim, ch, TYPE_UNDEFINED);
}